

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *p)

{
  long lVar1;
  int (*plits) [64];
  Bmc_EsPar_t *pBVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int (*plits_00) [64];
  long lVar13;
  bmcg_sat_solver *pbVar14;
  int iVar15;
  long lVar16;
  int *piVar17;
  int (*local_58) [32];
  int Node [2];
  int Entry [2];
  
  plits = p->pLits;
  iVar15 = 0;
  for (iVar11 = p->pPars->nVars; iVar10 = p->nObjs, iVar11 < iVar10; iVar11 = iVar11 + 1) {
    iVar4 = Zyx_ManCollectFanins(p,iVar11);
    iVar10 = p->pPars->nLutSize;
    if (iVar4 != iVar10) {
      if (iVar4 != p->nLits[1]) {
        __assert_fail("nFanins == p->nLits[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x364,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      iVar15 = iVar15 + 1;
      if (iVar10 < iVar4) {
        iVar10 = iVar10 + 1;
        p->nLits[1] = iVar10;
        pbVar14 = p->pSat;
        plits_00 = p->pLits + 1;
      }
      else {
        pbVar14 = p->pSat;
        iVar10 = p->nLits[0];
        plits_00 = plits;
      }
      iVar10 = bmcg_sat_solver_addclause(pbVar14,*plits_00,iVar10);
      if (iVar10 == 0) {
        return -1;
      }
    }
  }
  if (iVar15 == 0) {
    if (p->pPars->fOrderNodes == 0) {
      iVar15 = 0;
    }
    else {
      iVar11 = p->pPars->nVars;
      lVar16 = (long)iVar11;
      local_58 = p->pFanins + lVar16 + 1;
      piVar17 = p->pFanins[lVar16] + 0x1f;
      iVar15 = 0;
LAB_004abdad:
      iVar11 = iVar11 + 1;
      lVar1 = lVar16 + 1;
      if (lVar1 < iVar10) {
        pBVar2 = p->pPars;
        uVar12 = pBVar2->nLutSize;
        uVar9 = (ulong)uVar12;
        lVar3 = 0;
        do {
          lVar13 = lVar3;
          iVar4 = (int)lVar16;
          if ((int)((int)lVar13 + uVar12) < 1) {
            if (uVar9 + lVar13 == 0) {
              if (pBVar2->fMajority != 0) goto LAB_004ac1ae;
              iVar10 = p->LutMask;
              goto LAB_004abfbf;
            }
            break;
          }
          lVar3 = lVar13 + -1;
        } while (piVar17[uVar9 + lVar13 + -0x20] == piVar17[uVar9 + lVar13]);
        iVar5 = uVar12 - 1;
        iVar6 = *(int *)((long)(local_58 + -1) + lVar13 * 4 + (long)iVar5 * 4);
        if ((*local_58)[iVar5 + lVar13] <= iVar6) {
          iVar10 = bmcg_sat_solver_read_cex_varvalue
                             (p->pSat,iVar6 + p->TopoBase + (iVar4 - pBVar2->nVars) * iVar10);
          if (iVar10 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3a3,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          iVar10 = bmcg_sat_solver_read_cex_varvalue
                             (p->pSat,p->TopoBase +
                                      *(int *)((long)(local_58 + -1) + lVar13 * 4 + (long)iVar5 * 4)
                                      + ((int)lVar1 - p->pPars->nVars) * p->nObjs);
          if (iVar10 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i-1][k])) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3a4,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          p->nLits[0] = 0;
          iVar10 = *(int *)((long)(local_58 + -1) + lVar13 * 4 + (long)iVar5 * 4);
          while( true ) {
            pbVar14 = p->pSat;
            if (p->nObjs + -1 <= iVar10) break;
            iVar6 = bmcg_sat_solver_read_cex_varvalue
                              (pbVar14,p->nObjs * (iVar4 - p->pPars->nVars) + p->TopoBase + iVar10);
            iVar5 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,(iVar11 - p->pPars->nVars) * p->nObjs + p->TopoBase + iVar10)
            ;
            iVar7 = Abc_Var2Lit((iVar4 - p->pPars->nVars) * p->nObjs + p->TopoBase + iVar10,iVar6);
            iVar6 = p->nLits[0];
            p->nLits[0] = iVar6 + 1;
            p->pLits[0][iVar6] = iVar7;
            iVar5 = Abc_Var2Lit((iVar11 - p->pPars->nVars) * p->nObjs + p->TopoBase + iVar10,iVar5);
            iVar6 = p->nLits[0];
            p->nLits[0] = iVar6 + 1;
            p->pLits[0][iVar6] = iVar5;
            iVar10 = iVar10 + 1;
          }
          goto LAB_004ac187;
        }
        iVar10 = bmcg_sat_solver_read_cex_varvalue
                           (p->pSat,(*local_58)[iVar5 + lVar13] + p->TopoBase +
                                    (iVar4 - pBVar2->nVars) * iVar10);
        if (iVar10 != 0) {
          __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x39e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        iVar10 = bmcg_sat_solver_read_cex_varvalue
                           (p->pSat,p->TopoBase + (*local_58)[iVar5 + lVar13] +
                                    ((int)lVar1 - p->pPars->nVars) * p->nObjs);
        if (iVar10 != 1) {
          __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i][k])) == 1"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x39f,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        goto LAB_004ac1ae;
      }
      uVar12 = 0;
      while( true ) {
        if (p->vPairs->nSize <= (int)(uVar12 | 1)) break;
        iVar11 = Vec_IntEntry(p->vPairs,uVar12);
        Entry[0] = iVar11;
        iVar10 = Vec_IntEntry(p->vPairs,uVar12 | 1);
        Entry[1] = iVar10;
        if (iVar10 <= iVar11) {
          __assert_fail("Entry[0] < Entry[1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x3b8,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        lVar16 = 0;
        while (iVar4 = Node[1], lVar16 != 2) {
          Node[lVar16] = -1;
          for (iVar4 = p->pPars->nVars; iVar6 = -1, iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
            iVar6 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,p->TopoBase + Entry[lVar16] +
                                       (iVar4 - p->pPars->nVars) * p->nObjs);
            if (iVar6 != 0) {
              Node[lVar16] = iVar4;
              iVar6 = iVar4;
              break;
            }
          }
          lVar16 = lVar16 + 1;
          if (iVar6 < p->pPars->nVars) {
            __assert_fail("Node[j] >= p->pPars->nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3c2,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
        }
        if (Node[1] < Node[0]) {
          iVar6 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,p->TopoBase + iVar11 + (Node[1] - p->pPars->nVars) * p->nObjs);
          if (iVar6 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3ca,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          iVar6 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,p->TopoBase + iVar10 + (iVar4 - p->pPars->nVars) * p->nObjs);
          if (iVar6 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3cb,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          p->nLits[0] = 0;
          iVar15 = iVar15 + 1;
          for (iVar6 = p->pPars->nVars; iVar6 <= iVar4; iVar6 = iVar6 + 1) {
            iVar5 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,p->TopoBase + iVar11 + (iVar6 - p->pPars->nVars) * p->nObjs);
            iVar7 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,p->TopoBase + iVar10 + (iVar6 - p->pPars->nVars) * p->nObjs);
            iVar8 = Abc_Var2Lit(p->TopoBase + iVar11 + (iVar6 - p->pPars->nVars) * p->nObjs,iVar5);
            iVar5 = p->nLits[0];
            p->nLits[0] = iVar5 + 1;
            p->pLits[0][iVar5] = iVar8;
            iVar7 = Abc_Var2Lit(p->TopoBase + iVar10 + (iVar6 - p->pPars->nVars) * p->nObjs,iVar7);
            iVar5 = p->nLits[0];
            p->nLits[0] = iVar5 + 1;
            p->pLits[0][iVar5] = iVar7;
          }
          iVar11 = bmcg_sat_solver_addclause(p->pSat,*plits,p->nLits[0]);
          if (iVar11 == 0) {
            return -1;
          }
        }
        uVar12 = uVar12 + 2;
      }
    }
  }
  return iVar15;
LAB_004abfbf:
  if (iVar10 < 0) goto LAB_004ac00b;
  iVar6 = bmcg_sat_solver_read_cex_varvalue
                    (p->pSat,(iVar4 - p->pPars->nVars) * (p->LutMask + 1) + iVar10);
  iVar5 = bmcg_sat_solver_read_cex_varvalue
                    (p->pSat,(iVar11 - p->pPars->nVars) * (p->LutMask + 1) + iVar10);
  if (iVar6 != iVar5) goto LAB_004ac010;
  iVar10 = iVar10 + -1;
  goto LAB_004abfbf;
LAB_004ac00b:
  if (iVar10 != -1) {
LAB_004ac010:
    iVar6 = bmcg_sat_solver_read_cex_varvalue
                      (p->pSat,(iVar4 - p->pPars->nVars) * (p->LutMask + 1) + iVar10);
    if ((iVar6 != 0) ||
       (iVar6 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,(iVar11 - p->pPars->nVars) * (p->LutMask + 1) + iVar10),
       iVar6 != 1)) {
      iVar6 = bmcg_sat_solver_read_cex_varvalue
                        (p->pSat,(iVar4 - p->pPars->nVars) * (p->LutMask + 1) + iVar10);
      if (iVar6 != 1) {
        __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x38d,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      iVar6 = bmcg_sat_solver_read_cex_varvalue
                        (p->pSat,(iVar11 - p->pPars->nVars) * (p->LutMask + 1) + iVar10);
      if (iVar6 != 0) {
        __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i , k)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x38e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      p->nLits[0] = 0;
      for (iVar6 = p->LutMask; pbVar14 = p->pSat, iVar10 <= iVar6; iVar6 = iVar6 + -1) {
        iVar5 = bmcg_sat_solver_read_cex_varvalue
                          (pbVar14,(iVar4 - p->pPars->nVars) * (p->LutMask + 1) + iVar6);
        iVar7 = bmcg_sat_solver_read_cex_varvalue
                          (p->pSat,(iVar11 - p->pPars->nVars) * (p->LutMask + 1) + iVar6);
        iVar8 = Abc_Var2Lit((iVar4 - p->pPars->nVars) * (p->LutMask + 1) + iVar6,iVar5);
        iVar5 = p->nLits[0];
        p->nLits[0] = iVar5 + 1;
        p->pLits[0][iVar5] = iVar8;
        iVar7 = Abc_Var2Lit((iVar11 - p->pPars->nVars) * (p->LutMask + 1) + iVar6,iVar7);
        iVar5 = p->nLits[0];
        p->nLits[0] = iVar5 + 1;
        p->pLits[0][iVar5] = iVar7;
      }
LAB_004ac187:
      iVar15 = iVar15 + 1;
      iVar10 = bmcg_sat_solver_addclause(pbVar14,*plits,p->nLits[0]);
      if (iVar10 == 0) {
        return -1;
      }
    }
  }
LAB_004ac1ae:
  iVar10 = p->nObjs;
  local_58 = local_58 + 1;
  piVar17 = piVar17 + 0x20;
  lVar16 = lVar1;
  goto LAB_004abdad;
}

Assistant:

int Zyx_ManAddCnfLazyTopo( Zyx_Man_t * p )
{
    int i, k, j, Entry[2], Node[2], nLazy = 0;
    // fanin count
    //printf( "Adding topology clauses.\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        if ( nFanins == p->pPars->nLutSize )
            continue;
        nLazy++;
        assert( nFanins == p->nLits[1] );
        if ( p->nLits[1] > p->pPars->nLutSize )
        {
            p->nLits[1] = p->pPars->nLutSize + 1;
            //Zyx_PrintClause( p->pLits[1], p->nLits[1] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[1], p->nLits[1] ) )
                return -1;
        }
        else // if ( p->nLits[1] < p->pPars->nLutSize )
        {
            //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
        }
    }
    if ( nLazy || !p->pPars->fOrderNodes )
        return nLazy;
    // ordering
    for ( i = p->pPars->nVars + 1; i < p->nObjs; i++ )
    {
        for ( k = p->pPars->nLutSize - 1; k >= 0; k-- )
            if ( p->pFanins[i-1][k] != p->pFanins[i][k] )
                break;
        if ( k == -1 ) // fanins are equal
        {
            if ( p->pPars->fMajority )
                continue;
            // compare by LUT functions
            for ( k = p->LutMask; k >= 0; k-- )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) != 
                     bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) )
                    break;
            if ( k == -1 ) // truth tables cannot be equal
                continue;
            // rule out these truth tables
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 0 && 
                 bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 1 )
            {
                continue;
            }
            nLazy++;
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 0 );
            // rule out this order
            p->nLits[0] = 0;
            for ( j = p->LutMask; j >= k; j-- )
            {
                int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, j));
                int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i,   j));
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i-1, j), ValA );
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i,   j), ValB );
            }
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
            continue;
        }
        if ( p->pFanins[i-1][k] < p->pFanins[i][k] )
        {
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i][k])) == 1 );
            continue;
        }
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i-1][k])) == 0 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pFanins[i-1][k]; j < p->nObjs-1; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, j));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i,   j));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i-1, j), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i,   j), ValB );
        }
        //printf( "\n" );
        //Zyx_ManPrintVarMap( p, 1 );
        //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
        //break;
    }
    // check symmetric variables
    Vec_IntForEachEntryDouble( p->vPairs, Entry[0], Entry[1], k )
    {
        assert( Entry[0] < Entry[1] );
        for ( j = 0; j < 2; j++ )
        {
            Node[j] = -1;
            for ( i = p->pPars->nVars; i < p->nObjs; i++ )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, Entry[j])) )
                {
                    Node[j] = i;
                    break;
                }
            assert( Node[j] >= p->pPars->nVars );
        }
        // compare the nodes
        if ( Node[0] <= Node[1] )
            continue;
        assert( Node[0] > Node[1] );
        // create blocking clause
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pPars->nVars; j <= Node[1]; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[0]));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[1]));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[0]), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[1]), ValB );
        }
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
    }
    return nLazy;
}